

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

void draw_shape(element_t *element,render_context_t *context,render_state_t *state)

{
  element **ppeVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  size_t sVar7;
  plutovg_canvas_t *ppVar8;
  long lVar9;
  _Bool _Var10;
  int iVar11;
  plutovg_line_cap_t line_cap;
  char *it;
  attribute *paVar12;
  byte *pbVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  length_t *length;
  plutovg_fill_rule_t winding;
  plutovg_line_join_t line_join;
  element *peVar17;
  element *peVar18;
  render_context_t *prVar19;
  ulong uVar20;
  ulong uVar21;
  byte *end;
  bool bVar22;
  float fVar23;
  length_t stroke_width;
  float miter_limit;
  length_t dash_offset;
  float stroke_opacity;
  paint_t stroke;
  paint_t fill;
  float dashes [128];
  float fill_opacity;
  length_t local_6a8;
  float local_69c;
  ulong local_698;
  render_context_t *local_690;
  length_t local_688;
  float local_67c;
  paint_t local_678;
  paint_t local_658;
  byte *local_638 [64];
  length_t local_438 [128];
  ulong local_38;
  
  local_678.id.data = (char *)0x0;
  local_678.id.length = 0;
  local_678.type = paint_type_none;
  local_678.color.type = color_type_fixed;
  local_678.color.value = 0;
  local_678._12_4_ = 0;
  parse_paint(element,0x1d,&local_678);
  local_6a8.value = 1.0;
  local_6a8.type = length_type_fixed;
  local_69c = 4.0;
  local_690 = context;
  if (local_678.type != paint_type_none) {
    parse_length(element,0x24,&local_6a8,false,true);
    peVar18 = element;
    do {
      for (paVar12 = peVar18->attributes; peVar17 = element, paVar12 != (attribute *)0x0;
          paVar12 = paVar12->next) {
        if (paVar12->id == 0x20) {
          pcVar6 = (paVar12->value).data;
          sVar7 = (paVar12->value).length;
          if (sVar7 == 7) {
            iVar11 = strncmp(pcVar6,"inherit",7);
            if (iVar11 == 0) break;
            pcVar16 = pcVar6 + 7;
          }
          else {
            pcVar16 = pcVar6 + sVar7;
            if ((long)sVar7 < 1) {
              pcVar15 = "round";
              bVar22 = false;
              goto LAB_001075a8;
            }
          }
          line_cap = PLUTOVG_LINE_CAP_BUTT;
          lVar14 = 0;
          goto LAB_0010754c;
        }
      }
      peVar18 = peVar18->parent;
    } while (peVar18 != (element *)0x0);
LAB_001074f2:
    line_cap = PLUTOVG_LINE_CAP_BUTT;
    goto LAB_00107611;
  }
  local_698 = 0;
  line_cap = PLUTOVG_LINE_CAP_BUTT;
  if (state->mode == render_mode_bounding) {
    return;
  }
  goto LAB_001076bc;
  while( true ) {
    if (pcVar6[lVar14] != "butt"[lVar14]) goto LAB_0010757a;
    lVar9 = lVar14 + 1;
    lVar14 = lVar14 + 1;
    if (pcVar6 + lVar9 == pcVar16) break;
LAB_0010754c:
    if (lVar14 == 4) goto LAB_00107611;
  }
  if ("butt"[sVar7] != '\0') {
LAB_0010757a:
    pcVar15 = "round" + sVar7;
    lVar14 = 0;
    do {
      if (lVar14 == 5) goto LAB_001075e2;
      if (pcVar6[lVar14] != "round"[lVar14]) goto LAB_001075b1;
      lVar9 = lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (pcVar6 + lVar9 != pcVar16);
    bVar22 = true;
LAB_001075a8:
    if (*pcVar15 == '\0') {
LAB_001075e2:
      line_cap = PLUTOVG_LINE_CAP_ROUND;
    }
    else {
      if (bVar22) {
LAB_001075b1:
        pcVar15 = "square" + sVar7;
        lVar14 = 0;
        do {
          if (lVar14 == 6) {
            line_cap = PLUTOVG_LINE_CAP_SQUARE;
            goto LAB_00107611;
          }
          if (pcVar6[lVar14] != "square"[lVar14]) goto LAB_001074f2;
          lVar9 = lVar14 + 1;
          lVar14 = lVar14 + 1;
        } while (pcVar6 + lVar9 != pcVar16);
      }
      else {
        pcVar15 = "square";
      }
      line_cap = (uint)(*pcVar15 == '\0') * 2;
    }
  }
LAB_00107611:
  do {
    for (paVar12 = peVar17->attributes; paVar12 != (attribute *)0x0; paVar12 = paVar12->next) {
      if (paVar12->id == 0x21) {
        pcVar6 = (paVar12->value).data;
        sVar7 = (paVar12->value).length;
        if (sVar7 == 7) {
          iVar11 = strncmp(pcVar6,"inherit",7);
          if (iVar11 == 0) break;
          pcVar16 = pcVar6 + 7;
        }
        else {
          pcVar16 = pcVar6 + sVar7;
          if ((long)sVar7 < 1) {
            pcVar15 = "round";
            bVar22 = false;
            goto LAB_00107976;
          }
        }
        uVar20 = 0;
        lVar14 = 0;
        goto LAB_0010791a;
      }
    }
    ppeVar1 = &peVar17->parent;
    peVar17 = *ppeVar1;
  } while (*ppeVar1 != (element *)0x0);
LAB_0010765a:
  uVar20 = 0;
  goto LAB_0010765d;
  while( true ) {
    if (pcVar6[lVar14] != "nonzero"[lVar14]) goto LAB_00107a28;
    lVar9 = lVar14 + 1;
    lVar14 = lVar14 + 1;
    if (pcVar6 + lVar9 == pcVar15) break;
LAB_001079fa:
    if (lVar14 == 7) goto LAB_00107779;
  }
  if ("nonzero"[sVar7] != '\0') {
LAB_00107a28:
    pcVar16 = "evenodd" + sVar7;
    lVar14 = 0;
    do {
      if (lVar14 == 7) {
        winding = PLUTOVG_FILL_RULE_EVEN_ODD;
        goto LAB_00107779;
      }
      if (pcVar6[lVar14] != "evenodd"[lVar14]) goto LAB_00107777;
      lVar9 = lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (pcVar6 + lVar9 != pcVar15);
LAB_00107cbc:
    winding = (plutovg_fill_rule_t)(*pcVar16 == '\0');
  }
  goto LAB_00107779;
LAB_00107a80:
  do {
    if (0x7f < uVar20) goto LAB_00107b5a;
    _Var10 = parse_length_value((char **)local_638,(char *)end,local_438 + uVar20,false);
    if (!_Var10) break;
    if (((local_638[0] < end) && ((ulong)*local_638[0] < 0x2d)) &&
       ((0x100100002600U >> ((ulong)*local_638[0] & 0x3f) & 1) != 0)) {
      bVar22 = true;
      do {
        pbVar13 = local_638[0];
        if ((0x20 < (ulong)*local_638[0]) ||
           ((0x100002600U >> ((ulong)*local_638[0] & 0x3f) & 1) == 0)) break;
        local_638[0] = local_638[0] + 1;
        bVar22 = local_638[0] < end;
        pbVar13 = end;
      } while (local_638[0] != end);
      local_638[0] = pbVar13;
      if (((bVar22) && (pbVar13 < end)) &&
         ((*pbVar13 == 0x2c && (pbVar13 = pbVar13 + 1, local_638[0] = pbVar13, pbVar13 < end)))) {
        do {
          local_638[0] = pbVar13;
          if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          break;
          pbVar13 = pbVar13 + 1;
          local_638[0] = end;
        } while (pbVar13 != end);
      }
    }
    uVar20 = local_38 + 1;
    local_38 = uVar20;
  } while (local_638[0] < end);
  uVar20 = local_38;
  if (local_38 == 0) goto LAB_00107887;
LAB_00107b5a:
  uVar21 = 0;
  line_join = (plutovg_line_join_t)local_698;
  do {
    fVar23 = resolve_length(state,length,'o');
    (&local_438[-0x40].value)[uVar21] = fVar23;
    uVar21 = uVar21 + 1;
    length = length + 1;
  } while (uVar20 != uVar21);
  goto LAB_00107b88;
  while( true ) {
    if (pcVar6[lVar14] != "miter"[lVar14]) goto LAB_00107948;
    lVar9 = lVar14 + 1;
    lVar14 = lVar14 + 1;
    if (pcVar6 + lVar9 == pcVar16) break;
LAB_0010791a:
    if (lVar14 == 5) goto LAB_0010765d;
  }
  if ("miter"[sVar7] != '\0') {
LAB_00107948:
    pcVar15 = "round" + sVar7;
    lVar14 = 0;
    do {
      if (lVar14 == 5) goto LAB_001079bb;
      if (pcVar6[lVar14] != "round"[lVar14]) goto LAB_00107983;
      lVar9 = lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (pcVar6 + lVar9 != pcVar16);
    bVar22 = true;
LAB_00107976:
    if (*pcVar15 == '\0') {
LAB_001079bb:
      uVar20 = 1;
    }
    else {
      if (bVar22) {
LAB_00107983:
        pcVar15 = "bevel" + sVar7;
        lVar14 = 0;
        do {
          if (lVar14 == 5) {
            uVar20 = 2;
            goto LAB_0010765d;
          }
          if (pcVar6[lVar14] != "bevel"[lVar14]) goto LAB_0010765a;
          lVar9 = lVar14 + 1;
          lVar14 = lVar14 + 1;
        } while (pcVar6 + lVar9 != pcVar16);
      }
      else {
        pcVar15 = "bevel";
      }
      uVar20 = (ulong)((uint)(*pcVar15 == '\0') * 2);
    }
  }
LAB_0010765d:
  parse_number(element,0x22,&local_69c,false,true);
  local_698 = uVar20;
  if (state->mode == render_mode_bounding) {
    if (local_6a8.type == length_type_percent) {
      fVar23 = hypotf(state->view_width,state->view_height);
      local_6a8.value = ((fVar23 / 1.4142135) * local_6a8.value) / 100.0;
    }
    else {
    }
    local_6a8.value = local_6a8.value * 0.5;
    fVar23 = local_6a8.value;
    if (line_cap == PLUTOVG_LINE_CAP_SQUARE) {
      fVar23 = local_6a8.value * 1.4142135;
    }
    if ((int)uVar20 == 0) {
      local_6a8.value = local_6a8.value * local_69c;
    }
    if (fVar23 <= local_6a8.value) {
      fVar23 = local_6a8.value;
    }
    uVar2 = (state->extents).x;
    uVar4 = (state->extents).y;
    uVar3 = (state->extents).w;
    uVar5 = (state->extents).h;
    (state->extents).x = (float)uVar2 - fVar23;
    (state->extents).y = (float)uVar4 - fVar23;
    (state->extents).w = fVar23 + fVar23 + (float)uVar3;
    (state->extents).h = fVar23 + fVar23 + (float)uVar5;
  }
  else {
LAB_001076bc:
    prVar19 = local_690;
    local_658.id.data = (char *)0x0;
    local_658.id.length = 0;
    local_658.type = paint_type_color;
    local_658.color.type = color_type_fixed;
    local_658.color.value = 0xff000000;
    local_658._12_4_ = 0;
    parse_paint(element,9,&local_658);
    _Var10 = apply_paint(state,prVar19,&local_658);
    if (_Var10) {
      local_438[0].value = 1.0;
      parse_number(element,10,&local_438[0].value,true,true);
      peVar18 = element;
      do {
        for (paVar12 = peVar18->attributes; paVar12 != (attribute *)0x0; paVar12 = paVar12->next) {
          if (paVar12->id == 0xb) {
            pcVar6 = (paVar12->value).data;
            sVar7 = (paVar12->value).length;
            if (sVar7 == 7) {
              iVar11 = strncmp(pcVar6,"inherit",7);
              if (iVar11 == 0) break;
              pcVar15 = pcVar6 + 7;
            }
            else {
              if ((long)sVar7 < 1) {
                pcVar16 = "evenodd";
                goto LAB_00107cbc;
              }
              pcVar15 = pcVar6 + sVar7;
            }
            winding = PLUTOVG_FILL_RULE_NON_ZERO;
            lVar14 = 0;
            goto LAB_001079fa;
          }
        }
        peVar18 = peVar18->parent;
      } while (peVar18 != (element *)0x0);
LAB_00107777:
      winding = PLUTOVG_FILL_RULE_NON_ZERO;
LAB_00107779:
      prVar19 = local_690;
      plutovg_canvas_set_fill_rule(local_690->canvas,winding);
      plutovg_canvas_set_opacity(prVar19->canvas,local_438[0].value * state->opacity);
      plutovg_canvas_set_matrix(prVar19->canvas,&state->matrix);
      plutovg_canvas_fill_path(prVar19->canvas,prVar19->document->path);
    }
    _Var10 = apply_paint(state,prVar19,&local_678);
    if (_Var10) {
      local_67c = 1.0;
      parse_number(element,0x23,&local_67c,true,true);
      local_688.value = 0.0;
      local_688.type = length_type_fixed;
      parse_length(element,0x1f,&local_688,false,true);
      length = local_438;
      memset(length,0,0x408);
      do {
        for (paVar12 = element->attributes; paVar12 != (attribute *)0x0; paVar12 = paVar12->next) {
          if (paVar12->id == 0x1e) {
            pbVar13 = (byte *)(paVar12->value).data;
            sVar7 = (paVar12->value).length;
            if (sVar7 == 7) {
              iVar11 = strncmp((char *)pbVar13,"inherit",7);
              if (iVar11 == 0) break;
            }
            else {
              local_638[0] = pbVar13;
              if ((long)sVar7 < 1) goto LAB_00107887;
            }
            end = pbVar13 + sVar7;
            uVar20 = 0;
            local_638[0] = pbVar13;
            goto LAB_00107a80;
          }
        }
        element = element->parent;
      } while (element != (element *)0x0);
LAB_00107887:
      uVar20 = 0;
      line_join = (plutovg_line_join_t)local_698;
LAB_00107b88:
      prVar19 = local_690;
      ppVar8 = local_690->canvas;
      if (local_688.type == length_type_percent) {
        fVar23 = hypotf(state->view_width,state->view_height);
        fVar23 = ((fVar23 / 1.4142135) * local_688.value) / 100.0;
      }
      else {
        fVar23 = local_688.value;
      }
      plutovg_canvas_set_dash_offset(ppVar8,fVar23);
      plutovg_canvas_set_dash_array(prVar19->canvas,(float *)local_638,(int)uVar20);
      ppVar8 = prVar19->canvas;
      if (local_6a8.type == length_type_percent) {
        fVar23 = hypotf(state->view_width,state->view_height);
        fVar23 = ((fVar23 / 1.4142135) * local_6a8.value) / 100.0;
      }
      else {
        fVar23 = local_6a8.value;
      }
      plutovg_canvas_set_line_width(ppVar8,fVar23);
      plutovg_canvas_set_line_cap(prVar19->canvas,line_cap);
      plutovg_canvas_set_line_join(prVar19->canvas,line_join);
      plutovg_canvas_set_miter_limit(prVar19->canvas,local_69c);
      plutovg_canvas_set_opacity(prVar19->canvas,local_67c * state->opacity);
      plutovg_canvas_set_matrix(prVar19->canvas,&state->matrix);
      plutovg_canvas_stroke_path(prVar19->canvas,prVar19->document->path);
    }
  }
  return;
}

Assistant:

static void draw_shape(const element_t* element, const render_context_t* context, render_state_t* state)
{
    paint_t stroke = {paint_type_none};
    parse_paint(element, ATTR_STROKE, &stroke);

    length_t stroke_width = {1.f, length_type_fixed};
    plutovg_line_cap_t line_cap = PLUTOVG_LINE_CAP_BUTT;
    plutovg_line_join_t line_join = PLUTOVG_LINE_JOIN_MITER;
    float miter_limit = 4.f;

    if(stroke.type > paint_type_none) {
        parse_length(element, ATTR_STROKE_WIDTH, &stroke_width, false, true);
        parse_line_cap(element, ATTR_STROKE_LINECAP, &line_cap);
        parse_line_join(element, ATTR_STROKE_LINEJOIN, &line_join);
        parse_number(element, ATTR_STROKE_MITERLIMIT, &miter_limit, false, true);
    }

    if(state->mode == render_mode_bounding) {
        if(stroke.type == paint_type_none)
            return;
        float line_width = resolve_length(state, &stroke_width, 'o');
        float cap_limit = line_width / 2.f;
        if(line_cap == PLUTOVG_LINE_CAP_SQUARE)
            cap_limit *= PLUTOVG_SQRT2;
        float join_limit = line_width / 2.f;
        if(line_join == PLUTOVG_LINE_JOIN_MITER) {
            join_limit *= miter_limit;
        }

        float delta = MAX(cap_limit, join_limit);
        state->extents.x -= delta;
        state->extents.y -= delta;
        state->extents.w += delta * 2.f;
        state->extents.h += delta * 2.f;
        return;
    }

    paint_t fill = {paint_type_color, {color_type_fixed, 0xFF000000}};
    parse_paint(element, ATTR_FILL, &fill);

    if(apply_paint(state, context, &fill)) {
        float fill_opacity = 1.f;
        parse_number(element, ATTR_FILL_OPACITY, &fill_opacity, true, true);

        plutovg_fill_rule_t fill_rule = PLUTOVG_FILL_RULE_NON_ZERO;
        parse_fill_rule(element, ATTR_FILL_RULE, &fill_rule);

        plutovg_canvas_set_fill_rule(context->canvas, fill_rule);
        plutovg_canvas_set_opacity(context->canvas, fill_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_fill_path(context->canvas, context->document->path);
    }

    if(apply_paint(state, context, &stroke)) {
        float stroke_opacity = 1.f;
        parse_number(element, ATTR_STROKE_OPACITY, &stroke_opacity, true, true);

        length_t dash_offset = {0.f, length_type_fixed};
        parse_length(element, ATTR_STROKE_DASHOFFSET, &dash_offset, false, true);

        stroke_dash_array_t dash_array = {0};
        parse_dash_array(element, ATTR_STROKE_DASHARRAY, &dash_array);

        float dashes[MAX_DASHES];
        for(int i = 0; i < dash_array.size; ++i) {
            dashes[i] = resolve_length(state, dash_array.data + i, 'o');
        }

        plutovg_canvas_set_dash_offset(context->canvas, resolve_length(state, &dash_offset, 'o'));
        plutovg_canvas_set_dash_array(context->canvas, dashes, dash_array.size);

        plutovg_canvas_set_line_width(context->canvas, resolve_length(state, &stroke_width, 'o'));
        plutovg_canvas_set_line_cap(context->canvas, line_cap);
        plutovg_canvas_set_line_join(context->canvas, line_join);
        plutovg_canvas_set_miter_limit(context->canvas, miter_limit);
        plutovg_canvas_set_opacity(context->canvas, stroke_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_stroke_path(context->canvas, context->document->path);
    }
}